

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall
chrono::ChArchiveIn::in<chrono::geometry::ChTriangle>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>_>
          *bVal)

{
  undefined1 auVar1 [16];
  vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_> *pvVar2;
  pointer pCVar3;
  pointer pCVar4;
  long lVar5;
  pointer pCVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  size_t arraysize;
  ChFunctorArchiveInSpecific<chrono::geometry::ChTriangle> specFuncA;
  char idname [20];
  size_type local_c8;
  undefined **local_c0;
  ChTriangle *local_b8;
  char *local_b0;
  undefined ***local_a8;
  undefined1 local_a0;
  char local_98 [24];
  undefined1 local_80 [72];
  double local_38;
  
  pvVar2 = bVal->_value;
  pCVar3 = (pvVar2->
           super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (pvVar2->
           super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pCVar6 = pCVar3;
  if (pCVar4 != pCVar3) {
    do {
      (**(pCVar6->super_ChGeometry)._vptr_ChGeometry)(pCVar6);
      pCVar6 = pCVar6 + 1;
    } while (pCVar6 != pCVar4);
    (pvVar2->
    super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pCVar3;
  }
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_c8);
  std::vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>::resize
            (bVal->_value,local_c8);
  if (local_c8 != 0) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      sprintf(local_98,"%lu",uVar7);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = DAT_00b689a8;
      auVar8 = vbroadcastsd_avx512f(auVar1);
      local_80._0_8_ = &PTR__ChGeometry_00b3e558;
      local_c0 = &PTR__ChFunctorArchiveIn_00b3ea40;
      local_a8 = &local_c0;
      local_a0 = 0;
      local_80._8_64_ = vpermt2pd_avx512f(_DAT_009d9fc0,auVar8);
      local_38 = (double)vmovlpd_avx(auVar8._0_16_);
      local_b8 = (ChTriangle *)local_80;
      local_b0 = local_98;
      (**(code **)(*(long *)this + 0x60))(this,&local_b0);
      geometry::ChTriangle::operator=
                ((ChTriangle *)
                 ((long)(((bVal->_value->
                          super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
                          )._M_impl.super__Vector_impl_data._M_start)->p1).m_data + lVar5 + -8),
                 (ChTriangle *)local_80);
      (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x50;
    } while (uVar7 < local_c8);
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }